

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O1

void despot::AEMS::FindMaxApproxErrorLeaf
               (QNode *qnode,double likelihood,double *bestAE,VNode **bestNode)

{
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  _Rb_tree_header *p_Var3;
  double dVar4;
  
  dVar4 = AEMS2Likelihood(qnode);
  pmVar1 = QNode::children(qnode);
  p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      FindMaxApproxErrorLeaf((VNode *)p_Var2[1]._M_parent,dVar4 * likelihood,bestAE,bestNode);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void AEMS::FindMaxApproxErrorLeaf(QNode* qnode, double likelihood,
	double& bestAE, VNode*& bestNode) {
	likelihood *= Likelihood(qnode);

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
		VNode* vnode = it->second;
		FindMaxApproxErrorLeaf(vnode, likelihood, bestAE, bestNode);
	}
}